

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

int __thiscall deqp::gles31::Functional::FmaCase::init(FmaCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  NotSupportedError *this_00;
  char *ctx_00;
  string local_40;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_CommonFunctionCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  ctx_00 = (char *)0x23;
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    ctx_00 = "GL_EXT_gpu_shader5";
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_CommonFunctionCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_gpu_shader5");
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"GL_EXT_gpu_shader5 not supported","");
      tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar2 = CommonFunctionCase::init(&this->super_CommonFunctionCase,(EVP_PKEY_CTX *)ctx_00);
  return iVar2;
}

Assistant:

void init (void)
	{
		if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))
				&& !m_context.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
			throw tcu::NotSupportedError("GL_EXT_gpu_shader5 not supported");

		CommonFunctionCase::init();
	}